

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RateCodingSynapse.cpp
# Opt level: O0

void __thiscall RateCodingSynapse::update(RateCodingSynapse *this)

{
  bool bVar1;
  reference ppEVar2;
  size_type sVar3;
  reference pvVar4;
  reference pdVar5;
  long in_RDI;
  double t;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  int i;
  double value;
  double currentTime;
  _Self *in_stack_ffffffffffffff68;
  _Self *in_stack_ffffffffffffff70;
  long *plVar6;
  long *in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff80;
  uint in_stack_ffffffffffffff84;
  Logging *in_stack_ffffffffffffff90;
  _Deque_iterator<double,_double_&,_double_*> local_48;
  reference local_28;
  int local_1c;
  double local_18;
  double local_10;
  
  local_10 = Clock::getCurrentTime(*(Clock **)(in_RDI + 0x38));
  local_18 = 0.0;
  for (local_1c = 0; local_1c < *(int *)(in_RDI + 0x58); local_1c = local_1c + 1) {
    ppEVar2 = std::vector<Event_*,_std::allocator<Event_*>_>::operator[]
                        ((vector<Event_*,_std::allocator<Event_*>_> *)(*(long *)(in_RDI + 8) + 8),
                         (long)local_1c);
    if ((*ppEVar2)->type == Spike) {
      std::
      vector<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
      ::operator[]((vector<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
                    *)(in_RDI + 0x20),(long)local_1c);
      std::deque<double,_std::allocator<double>_>::push_back
                ((deque<double,_std::allocator<double>_> *)in_stack_ffffffffffffff70,
                 (value_type_conflict3 *)in_stack_ffffffffffffff68);
      Logging::logEvent(*(Logging **)(in_RDI + 0x60),1,local_1c,0);
    }
    while( true ) {
      std::
      vector<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
      ::operator[]((vector<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
                    *)(in_RDI + 0x20),(long)local_1c);
      sVar3 = std::deque<double,_std::allocator<double>_>::size
                        ((deque<double,_std::allocator<double>_> *)0x17391d);
      in_stack_ffffffffffffff84 = in_stack_ffffffffffffff84 & 0xffffff;
      if (sVar3 != 0) {
        std::
        vector<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
        ::operator[]((vector<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
                      *)(in_RDI + 0x20),(long)local_1c);
        pvVar4 = std::deque<double,_std::allocator<double>_>::front
                           ((deque<double,_std::allocator<double>_> *)
                            CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
        in_stack_ffffffffffffff84 =
             CONCAT13(*pvVar4 < local_10 - **(double **)(in_RDI + 0x18),
                      (int3)in_stack_ffffffffffffff84);
      }
      if ((char)(in_stack_ffffffffffffff84 >> 0x18) == '\0') break;
      std::
      vector<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
      ::operator[]((vector<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
                    *)(in_RDI + 0x20),(long)local_1c);
      std::deque<double,_std::allocator<double>_>::pop_front
                ((deque<double,_std::allocator<double>_> *)in_stack_ffffffffffffff70);
    }
    local_28 = std::
               vector<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
                             *)(in_RDI + 0x20),(long)local_1c);
    std::deque<double,_std::allocator<double>_>::begin
              ((deque<double,_std::allocator<double>_> *)in_stack_ffffffffffffff68);
    std::deque<double,_std::allocator<double>_>::end
              ((deque<double,_std::allocator<double>_> *)in_stack_ffffffffffffff68);
    while (bVar1 = std::operator!=(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68), bVar1) {
      pdVar5 = std::_Deque_iterator<double,_double_&,_double_*>::operator*(&local_48);
      in_stack_ffffffffffffff90 = (Logging *)*pdVar5;
      local_18 = local_18 + 1.0;
      std::_Deque_iterator<double,_double_&,_double_*>::operator++(in_stack_ffffffffffffff70);
    }
    if ((*(byte *)(in_RDI + 0x68) & 1) == 0) {
      ppEVar2 = std::vector<Event_*,_std::allocator<Event_*>_>::operator[]
                          ((vector<Event_*,_std::allocator<Event_*>_> *)(in_RDI + 0x40),
                           (long)local_1c);
      ValueEvent::setValue((ValueEvent *)*ppEVar2,local_18);
      in_stack_ffffffffffffff78 = *(long **)(in_RDI + 0x10);
      in_stack_ffffffffffffff80 = local_1c;
      ppEVar2 = std::vector<Event_*,_std::allocator<Event_*>_>::operator[]
                          ((vector<Event_*,_std::allocator<Event_*>_> *)(in_RDI + 0x40),
                           (long)local_1c);
      (**(code **)(*in_stack_ffffffffffffff78 + 0x28))
                (in_stack_ffffffffffffff78,in_stack_ffffffffffffff80,*ppEVar2);
      Logging::logValue(in_stack_ffffffffffffff90,in_RDI,in_stack_ffffffffffffff84,
                        in_stack_ffffffffffffff80,(double)in_stack_ffffffffffffff78);
      local_18 = 0.0;
    }
  }
  local_18 = local_18 / (double)*(int *)(in_RDI + 0x58);
  if ((*(byte *)(in_RDI + 0x68) & 1) != 0) {
    ppEVar2 = std::vector<Event_*,_std::allocator<Event_*>_>::operator[]
                        ((vector<Event_*,_std::allocator<Event_*>_> *)(in_RDI + 0x40),0);
    ValueEvent::setValue((ValueEvent *)*ppEVar2,local_18);
    plVar6 = *(long **)(in_RDI + 0x10);
    ppEVar2 = std::vector<Event_*,_std::allocator<Event_*>_>::operator[]
                        ((vector<Event_*,_std::allocator<Event_*>_> *)(in_RDI + 0x40),0);
    (**(code **)(*plVar6 + 0x28))(plVar6,0,*ppEVar2);
    Logging::logValue(in_stack_ffffffffffffff90,in_RDI,in_stack_ffffffffffffff84,
                      in_stack_ffffffffffffff80,(double)in_stack_ffffffffffffff78);
  }
  return;
}

Assistant:

void RateCodingSynapse::update() {
    double currentTime = clock->getCurrentTime();
    double value = 0.0;
    for(int i = 0; i < inputSize; i++) {
        if(from_population->output[i]->type == EventType::Spike) {
            spikes[i].push_back(currentTime);
            logger->logEvent(1, i, EventType::Spike);
        }
        while(spikes[i].size() && spikes[i].front() < currentTime - param->time_window) {
            spikes[i].pop_front(); 
        }
        for(double t : spikes[i]) {
            value += 1;
        }
        if(!singleOutput) {
            static_cast<ValueEvent*>(output[i])->setValue(value);
            to_population->setInput(i, output[i]);
            logger->logValue((long)this, i, EventType::Value, value);
            value = 0.0;
        }
    }
    value = value / (double)inputSize;
    if(singleOutput) {
        static_cast<ValueEvent*>(output[0])->setValue(value);
        to_population->setInput(0, output[0]);
        logger->logValue((long)this, 0, EventType::Value, value);
    }
}